

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourcesGL.hpp
# Opt level: O0

void __thiscall
Diligent::ShaderResourcesGL::GLResourceAttribs::GLResourceAttribs
          (GLResourceAttribs *this,Char *_Name,SHADER_TYPE _ShaderStages,
          SHADER_RESOURCE_TYPE _ResourceType,PIPELINE_RESOURCE_FLAGS _ResourceFlags,
          Uint32 _ArraySize)

{
  PIPELINE_RESOURCE_FLAGS PVar1;
  Char *pCVar2;
  undefined1 local_c8 [8];
  string msg_4;
  string msg_3;
  string msg_2;
  string msg_1;
  string msg;
  Uint32 _ArraySize_local;
  PIPELINE_RESOURCE_FLAGS _ResourceFlags_local;
  SHADER_RESOURCE_TYPE _ResourceType_local;
  SHADER_TYPE _ShaderStages_local;
  Char *_Name_local;
  GLResourceAttribs *this_local;
  
  this->Name = _Name;
  this->ShaderStages = _ShaderStages;
  this->ResourceType = _ResourceType;
  this->ResourceFlags = _ResourceFlags;
  this->ArraySize = _ArraySize;
  if (_ShaderStages == SHADER_TYPE_UNKNOWN) {
    FormatString<char[44]>
              ((string *)((long)&msg_1.field_2 + 8),
               (char (*) [44])"At least one shader stage must be specified");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"GLResourceAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderResourcesGL.hpp"
               ,0x68);
    std::__cxx11::string::~string((string *)(msg_1.field_2._M_local_buf + 8));
  }
  if (_ResourceType == SHADER_RESOURCE_TYPE_UNKNOWN) {
    FormatString<char[29]>
              ((string *)((long)&msg_2.field_2 + 8),(char (*) [29])"Unknown shader resource type");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"GLResourceAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderResourcesGL.hpp"
               ,0x69);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  if (_ArraySize == 0) {
    FormatString<char[34]>
              ((string *)((long)&msg_3.field_2 + 8),
               (char (*) [34])"Array size must be greater than 1");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"GLResourceAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderResourcesGL.hpp"
               ,0x6a);
    std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
  }
  PVar1 = Diligent::operator&(this->ResourceFlags,PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER);
  if ((PVar1 != PIPELINE_RESOURCE_FLAG_NONE) &&
     (this->ResourceType != SHADER_RESOURCE_TYPE_TEXTURE_SRV)) {
    FormatString<char[73]>
              ((string *)((long)&msg_4.field_2 + 8),
               (char (*) [73])
               "PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER is only allowed for texture SRVs");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"GLResourceAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderResourcesGL.hpp"
               ,0x6c);
    std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
  }
  PVar1 = Diligent::operator&(this->ResourceFlags,PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER);
  if (((PVar1 != PIPELINE_RESOURCE_FLAG_NONE) &&
      (this->ResourceType != SHADER_RESOURCE_TYPE_BUFFER_SRV)) &&
     (this->ResourceType != SHADER_RESOURCE_TYPE_BUFFER_UAV)) {
    FormatString<char[81]>
              ((string *)local_c8,
               (char (*) [81])
               "PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER is only allowed for buffer SRVs and UAVs");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"GLResourceAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderResourcesGL.hpp"
               ,0x6e);
    std::__cxx11::string::~string((string *)local_c8);
  }
  return;
}

Assistant:

GLResourceAttribs(const Char*             _Name,
                          SHADER_TYPE             _ShaderStages,
                          SHADER_RESOURCE_TYPE    _ResourceType,
                          PIPELINE_RESOURCE_FLAGS _ResourceFlags,
                          Uint32                  _ArraySize) noexcept :
            // clang-format off
            Name         {_Name         },
            ShaderStages {_ShaderStages },
            ResourceType {_ResourceType },
            ResourceFlags{_ResourceFlags},
            ArraySize    {_ArraySize    }
        // clang-format on
        {
            VERIFY(_ShaderStages != SHADER_TYPE_UNKNOWN, "At least one shader stage must be specified");
            VERIFY(_ResourceType != SHADER_RESOURCE_TYPE_UNKNOWN, "Unknown shader resource type");
            VERIFY(_ArraySize >= 1, "Array size must be greater than 1");
            VERIFY((ResourceFlags & PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER) == 0 || ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_SRV,
                   "PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER is only allowed for texture SRVs");
            VERIFY((ResourceFlags & PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER) == 0 || ResourceType == SHADER_RESOURCE_TYPE_BUFFER_SRV || ResourceType == SHADER_RESOURCE_TYPE_BUFFER_UAV,
                   "PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER is only allowed for buffer SRVs and UAVs");
        }